

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XUtil.cpp
# Opt level: O2

DOMElement * xercesc_4_0::XUtil::getFirstChildElement(DOMNode *parent)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0x38;
  do {
    parent = (DOMNode *)
             (**(code **)((long)((DOMNode *)&parent->_vptr_DOMNode)->_vptr_DOMNode + lVar2))(parent)
    ;
    if (parent == (DOMNode *)0x0) {
      return (DOMElement *)0x0;
    }
    iVar1 = (*((DOMNode *)&parent->_vptr_DOMNode)->_vptr_DOMNode[4])(parent);
    lVar2 = 0x50;
  } while (iVar1 != 1);
  return (DOMElement *)parent;
}

Assistant:

DOMElement* XUtil::getFirstChildElement(const DOMNode* const parent)
{
    // search for node
    DOMNode* child = parent->getFirstChild();

    while (child != 0)
	{
        if (child->getNodeType() == DOMNode::ELEMENT_NODE)
            return (DOMElement*)child;

        child = child->getNextSibling();
    }

    // not found
    return 0;
}